

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

void fill_yrange(chunk *c,wchar_t x,wchar_t y1,wchar_t y2,wchar_t feat,wchar_t flag,_Bool light)

{
  loc grid;
  square *psVar1;
  
  if (y1 <= y2) {
    do {
      grid = (loc)loc(x,y1);
      square_set_feat((chunk_conflict *)c,grid,feat);
      psVar1 = square((chunk_conflict *)c,grid);
      flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
      if (flag != L'\0') {
        psVar1 = square((chunk_conflict *)c,grid);
        flag_on_dbg(psVar1->info,3,flag,"square(c, grid)->info","flag");
      }
      if (light) {
        psVar1 = square((chunk_conflict *)c,grid);
        flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
      }
      y1 = y1 + L'\x01';
    } while (y2 + L'\x01' != y1);
  }
  return;
}

Assistant:

static void fill_yrange(struct chunk *c, int x, int y1, int y2, int feat, 
						int flag, bool light)
{
	int y;
	for (y = y1; y <= y2; y++) {
		struct loc grid = loc(x, y);
		square_set_feat(c, grid, feat);
		sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
		if (flag) sqinfo_on(square(c, grid)->info, flag);
		if (light)
			sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}
}